

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O3

void phmap::priv::
     BucketCountAllocTest<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>,4ul,std::mutex>>
               (void)

{
  size_t sz;
  long lVar1;
  long lVar2;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  A alloc;
  parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_std::mutex>
  m;
  AssertHelper local_760;
  undefined1 local_758 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_750;
  undefined1 local_748 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_738;
  AssertHelper local_728;
  Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> local_720;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  local_718;
  
  local_720.id_ = 0;
  local_748._8_8_ = local_758;
  local_758 = (undefined1  [8])
              hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
              next_id<phmap::priv::StatefulTestingHash>()::gId;
  local_738._M_allocated_capacity = (size_type)&local_760;
  local_760.data_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId;
  local_748._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x7b;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId =
       (AssertHelperData *)
       ((long)&hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
               next_id<phmap::priv::StatefulTestingEqual>()::gId->type + 1);
  local_738._8_8_ = &local_720;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::parallel_hash_set<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
              *)&local_718);
  local_758 = (undefined1  [8])
              local_718.sets_._M_elems[0].set_.settings_.
              super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              .
              super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              .
              super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              .
              super__Tuple_impl<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              .
              super__Head_base<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_false>
              ._M_head_impl.id_;
  testing::internal::
  CmpHelperEQ<phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
            ((internal *)local_748,"m.get_allocator()","alloc",
             (Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *)local_758,&local_720);
  if (local_748[0] == '\0') {
    testing::Message::Message((Message *)local_758);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_760,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x78,pcVar3);
    testing::internal::AssertHelper::operator=(&local_760,(Message *)local_758);
    testing::internal::AssertHelper::~AssertHelper(&local_760);
    if (local_758 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_758 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_748._8_8_);
  }
  lVar2 = 0x38;
  lVar1 = 0;
  do {
    lVar1 = lVar1 + *(long *)((long)&local_718.sets_._M_elems[0].super_Lockable.super_mutex.
                                     super___mutex_base._M_mutex + lVar2);
    lVar2 = lVar2 + 0x70;
  } while (lVar2 != 0x738);
  local_758[0] = lVar1 == 0;
  local_750 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (lVar1 != 0) {
    testing::Message::Message((Message *)&local_760);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_748,(internal *)local_758,(AssertionResult *)"m.empty()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_728,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x79,(char *)local_748._0_8_);
    testing::internal::AssertHelper::operator=(&local_728,(Message *)&local_760);
    testing::internal::AssertHelper::~AssertHelper(&local_728);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_748._0_8_ != &local_738) {
      operator_delete((void *)local_748._0_8_,(ulong)(local_738._M_allocated_capacity + 1));
    }
    if (local_760.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_760.data_ + 8))();
    }
    if (local_750 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_750,local_750);
    }
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<>>>::
  operator()(local_748,local_758,
             (parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_std::mutex>
              *)0x2db865);
  if (local_748[0] == '\0') {
    testing::Message::Message((Message *)local_758);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_760,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x7a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_760,(Message *)local_758);
    testing::internal::AssertHelper::~AssertHelper(&local_760);
    if (local_758 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_758 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_748._8_8_);
  }
  local_758 = (undefined1  [8])
              parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              ::bucket_count(&local_718);
  local_760.data_._0_4_ = 0x7b;
  testing::internal::CmpHelperGE<unsigned_long,int>
            ((internal *)local_748,"m.bucket_count()","123",(unsigned_long *)local_758,
             (int *)&local_760);
  if (local_748[0] == '\0') {
    testing::Message::Message((Message *)local_758);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_748._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_748._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_760,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x7b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_760,(Message *)local_758);
    testing::internal::AssertHelper::~AssertHelper(&local_760);
    if (local_758 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_758 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_748._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_748 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_748._8_8_);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~parallel_hash_set(&local_718);
  return;
}

Assistant:

void BucketCountAllocTest(std::true_type) {
  using A = typename TypeParam::allocator_type;
  A alloc(0);
  TypeParam m(123, alloc);
  EXPECT_EQ(m.get_allocator(), alloc);
  EXPECT_TRUE(m.empty());
  EXPECT_THAT(m, ::testing::UnorderedElementsAre());
  EXPECT_GE(m.bucket_count(), 123);
}